

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::
     dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_0>
     ::run(generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *kernel)

{
  DstXprType *pDVar1;
  DstEvaluatorType *pDVar2;
  long lVar3;
  long lVar4;
  Index col;
  long lVar5;
  long lVar6;
  Index row;
  long lVar7;
  uint uVar8;
  
  pDVar1 = kernel->m_dstExpr;
  lVar3 = (pDVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
          m_cols;
  if (lVar3 < 1) {
    lVar3 = 0;
  }
  lVar4 = 0;
  for (lVar5 = 0; lVar5 != lVar3; lVar5 = lVar5 + 1) {
    lVar6 = (pDVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_rows;
    pDVar2 = kernel->m_dst;
    if (lVar6 < 1) {
      lVar6 = 0;
    }
    for (lVar7 = 0; lVar6 != lVar7; lVar7 = lVar7 + 1) {
      uVar8 = 0x3ff00000;
      if (lVar5 != lVar7) {
        uVar8 = 0;
      }
      *(ulong *)((long)(pDVar2->
                       super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                       ).m_d.data +
                lVar7 * 8 +
                (pDVar2->
                super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>)
                .m_d.m_outerStride * lVar4) = (ulong)uVar8 << 0x20;
    }
    lVar4 = lVar4 + 8;
  }
  return;
}

Assistant:

EIGEN_STRONG_INLINE run(Kernel &kernel)
  {
    for(Index outer = 0; outer < kernel.outerSize(); ++outer) {
      for(Index inner = 0; inner < kernel.innerSize(); ++inner) {
        kernel.assignCoeffByOuterInner(outer, inner);
      }
    }
  }